

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseString
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  ParseStringHelper(__return_storage_ptr__,this);
  if (__return_storage_ptr__->error_code_ == OK) {
    (*this->ow_->_vptr_ObjectWriter[0xd])
              (this->ow_,(this->key_).ptr_,(this->key_).length_,(this->parsed_).ptr_,
               (this->parsed_).length_);
    (this->key_).ptr_ = (char *)0x0;
    (this->key_).length_ = 0;
    (this->parsed_).ptr_ = (char *)0x0;
    (this->parsed_).length_ = 0;
    (this->parsed_storage_)._M_string_length = 0;
    *(this->parsed_storage_)._M_dataplus._M_p = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseString() {
  util::Status result = ParseStringHelper();
  if (result.ok()) {
    ow_->RenderString(key_, parsed_);
    key_ = StringPiece();
    parsed_ = StringPiece();
    parsed_storage_.clear();
  }
  return result;
}